

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          Recycler *recycler,
          SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
          *typeHandler)

{
  byte bVar1;
  byte bVar2;
  code *pcVar3;
  Type TVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar8;
  byte bVar9;
  byte bVar10;
  Type *addr;
  
  bVar1 = (typeHandler->super_DynamicTypeHandler).propertyTypes;
  (this->super_DynamicTypeHandler).propertyTypes = bVar1;
  (this->super_DynamicTypeHandler).flags = (typeHandler->super_DynamicTypeHandler).flags;
  (this->super_DynamicTypeHandler).offsetOfInlineSlots =
       (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots;
  iVar6 = (typeHandler->super_DynamicTypeHandler).slotCapacity;
  (this->super_DynamicTypeHandler).slotCapacity = iVar6;
  TVar4 = (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity;
  (this->super_DynamicTypeHandler).unusedBytes = (typeHandler->super_DynamicTypeHandler).unusedBytes
  ;
  (this->super_DynamicTypeHandler).inlineSlotCapacity = TVar4;
  (this->super_DynamicTypeHandler).protoCachesWereInvalidated = false;
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_0153d228
  ;
  (this->propertyMap).ptr =
       (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  bVar9 = typeHandler->field_0x28 & 1;
  bVar2 = this->field_0x28;
  this->field_0x28 = bVar2 & 0xfe | bVar9;
  bVar10 = typeHandler->field_0x28 & 2;
  this->field_0x28 = bVar2 & 0xfc | bVar9 | bVar10;
  this->field_0x28 = bVar2 & 0xf8 | bVar9 | bVar10 | typeHandler->field_0x28 & 4;
  this->numDeletedProperties = typeHandler->numDeletedProperties;
  this->nextPropertyIndex = typeHandler->nextPropertyIndex;
  if ((bVar1 & 0x40) >> 6 != ((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x155,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar5) goto LAB_00df2f54;
    *puVar7 = 0;
    iVar6 = (this->super_DynamicTypeHandler).slotCapacity;
  }
  if (0xfffe < iVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x156,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar5) {
LAB_00df2f54:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  addr = &this->propertyMap;
  pBVar8 = JsUtil::
           BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
           ::Clone((typeHandler->propertyMap).ptr);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pBVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(Recycler* recycler, SimpleDictionaryTypeHandlerBase * typeHandler) :
        DynamicTypeHandler(typeHandler),
        nextPropertyIndex(typeHandler->nextPropertyIndex),
        singletonInstance(nullptr),
        _gc_tag(typeHandler->_gc_tag),
        isUnordered(typeHandler->isUnordered),
        hasNamelessPropertyId(typeHandler->hasNamelessPropertyId),
        numDeletedProperties(typeHandler->numDeletedProperties)
    {
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);
        propertyMap = typeHandler->propertyMap->Clone();
    }